

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Object * __thiscall xt::VSeq::first(Object *__return_storage_ptr__,VSeq *this)

{
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&(this->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>);
  vector::nth(__return_storage_ptr__,(Vector *)&_Stack_28,this->index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Object VSeq::first() const { return vector::nth(v, index); }